

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Experiment.cpp
# Opt level: O2

void __thiscall
celero::Experiment::addProblemSpace
          (Experiment *this,shared_ptr<celero::TestFixture::ExperimentValue> *x,double scale)

{
  shared_ptr<celero::ExperimentResult> r;
  value_type local_48;
  __shared_ptr<celero::TestFixture::ExperimentValue,_(__gnu_cxx::_Lock_policy)2> local_38;
  Experiment *local_28;
  
  local_28 = this;
  std::make_shared<celero::ExperimentResult,celero::Experiment*>((Experiment **)&local_48);
  std::__shared_ptr<celero::TestFixture::ExperimentValue,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_38,
             &x->
              super___shared_ptr<celero::TestFixture::ExperimentValue,_(__gnu_cxx::_Lock_policy)2>);
  ExperimentResult::setProblemSpaceValue
            (local_48.super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,(shared_ptr<celero::TestFixture::ExperimentValue> *)&local_38,scale);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  std::
  vector<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>
  ::push_back((vector<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>
               *)(this->pimpl)._pimpl._M_t.
                 super___uniq_ptr_impl<celero::Experiment::Impl,_std::default_delete<celero::Experiment::Impl>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_celero::Experiment::Impl_*,_std::default_delete<celero::Experiment::Impl>_>
                 .super__Head_base<0UL,_celero::Experiment::Impl_*,_false>,&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void Experiment::addProblemSpace(std::shared_ptr<celero::TestFixture::ExperimentValue> x, double scale)
{
	auto r = std::make_shared<celero::ExperimentResult>(this);
	r->setProblemSpaceValue(x, scale);
	this->pimpl->results.push_back(r);
}